

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PushLine(Hunk *this,char edit,char *line)

{
  long *plVar1;
  _List_node_base *p_Var2;
  int iVar3;
  undefined7 in_register_00000031;
  long lVar4;
  
  iVar3 = (int)CONCAT71(in_register_00000031,edit);
  if (iVar3 == 0x2d) {
    this->removes_ = this->removes_ + 1;
    lVar4 = 0x68;
  }
  else if (iVar3 == 0x2b) {
    this->adds_ = this->adds_ + 1;
    lVar4 = 0x50;
  }
  else {
    if (iVar3 != 0x20) {
      return;
    }
    this->common_ = this->common_ + 1;
    FlushEdits(this);
    lVar4 = 0x38;
  }
  p_Var2 = (_List_node_base *)operator_new(0x20);
  *(char *)&p_Var2[1]._M_next = edit;
  p_Var2[1]._M_prev = (_List_node_base *)line;
  std::__detail::_List_node_base::_M_hook(p_Var2);
  plVar1 = (long *)((long)&this->left_start_ + lVar4);
  *plVar1 = *plVar1 + 1;
  return;
}

Assistant:

void PushLine(char edit, const char* line) {
    switch (edit) {
      case ' ':
        ++common_;
        FlushEdits();
        hunk_.push_back(std::make_pair(' ', line));
        break;
      case '-':
        ++removes_;
        hunk_removes_.push_back(std::make_pair('-', line));
        break;
      case '+':
        ++adds_;
        hunk_adds_.push_back(std::make_pair('+', line));
        break;
    }
  }